

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

size_t __thiscall CDBWrapper::DynamicMemoryUsage(CDBWrapper *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  LevelDBContext *pLVar4;
  _Storage<unsigned_long,_true> _Var5;
  Level level;
  _Alloc_hider _Var7;
  DB *category;
  long in_FS_OFFSET;
  string_view source_file;
  optional<unsigned_long> oVar8;
  string_view str;
  string_view logging_function;
  char *local_40;
  undefined8 local_38;
  string memory;
  char **ppcVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memory._M_dataplus._M_p = (pointer)&memory.field_2;
  memory._M_string_length = 0;
  memory.field_2._M_local_buf[0] = '\0';
  pLVar4 = DBContext(this);
  category = pLVar4->pdb;
  ppcVar6 = &local_40;
  local_40 = "leveldb.approximate-memory-usage";
  local_38 = 0x20;
  iVar3 = (*category->_vptr_DB[9])(category,ppcVar6,&memory);
  level = (Level)ppcVar6;
  if ((char)iVar3 != '\0') {
    str._M_str = memory._M_dataplus._M_p;
    str._M_len = memory._M_string_length;
    _Var7 = memory._M_dataplus;
    category = (DB *)memory._M_string_length;
    oVar8 = ToIntegral<unsigned_long>(str);
    level = (Level)_Var7._M_p;
    _Var5._M_value =
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) goto LAB_006c2d51;
  }
  bVar2 = ::LogAcceptCategory((LogFlags)category,level);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file._M_len = 0x56;
    logging_function._M_str = "DynamicMemoryUsage";
    logging_function._M_len = 0x12;
    ::LogPrintf_<>(logging_function,source_file,0x139,LEVELDB,Debug,
                   "Failed to get approximate-memory-usage property\n");
  }
  _Var5._M_value = 0;
LAB_006c2d51:
  std::__cxx11::string::~string((string *)&memory);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var5._M_value;
}

Assistant:

size_t CDBWrapper::DynamicMemoryUsage() const
{
    std::string memory;
    std::optional<size_t> parsed;
    if (!DBContext().pdb->GetProperty("leveldb.approximate-memory-usage", &memory) || !(parsed = ToIntegral<size_t>(memory))) {
        LogDebug(BCLog::LEVELDB, "Failed to get approximate-memory-usage property\n");
        return 0;
    }
    return parsed.value();
}